

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_965823::SmallVectorReferenceInvalidationTest<slang::SmallVector<int,_3UL>_>::
SmallVectorReferenceInvalidationTest
          (SmallVectorReferenceInvalidationTest<slang::SmallVector<int,_3UL>_> *this)

{
  int iVar1;
  int local_1c;
  
  Constructable::reset();
  (this->v).super_SmallVectorBase<int>.data_ =
       (pointer)(this->v).super_SmallVectorBase<int>.firstElement;
  (this->v).super_SmallVectorBase<int>.len = 0;
  (this->v).super_SmallVectorBase<int>.cap = 3;
  for (iVar1 = 1; iVar1 != 4; iVar1 = iVar1 + 1) {
    local_1c = iVar1;
    slang::SmallVectorBase<int>::emplace_back<int>((SmallVectorBase<int> *)this,&local_1c);
  }
  return;
}

Assistant:

SmallVectorReferenceInvalidationTest() {
        // Fill up the small size so that insertions move the elements.
        for (int it = 0, e = numBuiltinElts(v); it != e; ++it)
            v.emplace_back(it + 1);
    }